

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> * __thiscall
cs_impl::any::const_val<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>(any *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  error *peVar3;
  string local_38;
  
  if (this->mDat == (proxy *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*this->mDat->data->_vptr_baseHolder[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  if (*(char **)(puVar2 + 8) != "St10shared_ptrIN7cs_impl14runtime_cs_ext17fiber_holder_implEE") {
    iVar1 = strcmp("St10shared_ptrIN7cs_impl14runtime_cs_ext17fiber_holder_implEE",
                   *(char **)(puVar2 + 8));
    if (iVar1 != 0) {
      peVar3 = (error *)__cxa_allocate_exception(0x28);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E0006","");
      cov::error::error(peVar3,&local_38);
      __cxa_throw(peVar3,&cov::error::typeinfo,cov::error::~error);
    }
  }
  if (this->mDat != (proxy *)0x0) {
    return (shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *)(this->mDat->data + 1);
  }
  peVar3 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E0005","");
  cov::error::error(peVar3,&local_38);
  __cxa_throw(peVar3,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

const T &const_val() const
		{
			if (typeid(T) != this->type())
				throw cov::error("E0006");
			if (this->mDat == nullptr)
				throw cov::error("E0005");
			return static_cast<holder<T> *>(this->mDat->data)->data();
		}